

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::
     iuUniversalPrinter<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
     ::Print(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *value,
            iu_ostream *os)

{
  iu_ostream *os_local;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *value_local;
  
  UniversalPrintTo<std::__cxx11::u32string>(value,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }